

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O3

void gen_scbi2_i64(TCGContext_conflict12 *tcg_ctx,TCGv_i64 dl,TCGv_i64 dh,TCGv_i64 al,TCGv_i64 ah,
                  TCGv_i64 bl,TCGv_i64 bh)

{
  TCGTemp *pTVar1;
  TCGv_i64 ah_00;
  uintptr_t o_3;
  TCGv_i64 rl;
  uintptr_t o_1;
  uintptr_t o;
  uintptr_t o_2;
  TCGv_i64 rh;
  
  pTVar1 = tcg_temp_new_internal_s390x(tcg_ctx,TCG_TYPE_I64,false);
  rh = (TCGv_i64)((long)pTVar1 - (long)tcg_ctx);
  pTVar1 = tcg_temp_new_internal_s390x(tcg_ctx,TCG_TYPE_I64,false);
  rl = (TCGv_i64)((long)pTVar1 - (long)tcg_ctx);
  ah_00 = tcg_const_i64_s390x(tcg_ctx,0);
  tcg_gen_sub2_i64_s390x(tcg_ctx,rl,rh,al,ah_00,bl,ah_00);
  tcg_gen_andi_i64_s390x(tcg_ctx,rh,rh,1);
  tcg_gen_sub2_i64_s390x(tcg_ctx,rl,rh,ah,ah_00,rh,ah_00);
  tcg_gen_sub2_i64_s390x(tcg_ctx,rl,rh,rl,rh,bh,ah_00);
  tcg_gen_addi_i64_s390x(tcg_ctx,dl,rh,1);
  if (ah_00 != dh) {
    tcg_gen_op2_s390x(tcg_ctx,INDEX_op_mov_i64,(TCGArg)(dh + (long)tcg_ctx),
                      (TCGArg)(ah_00 + (long)&tcg_ctx->pool_cur));
  }
  tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(rh + (long)tcg_ctx));
  tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(rl + (long)tcg_ctx));
  tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(ah_00 + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_scbi2_i64(TCGContext *tcg_ctx, TCGv_i64 dl, TCGv_i64 dh, TCGv_i64 al,
                          TCGv_i64 ah, TCGv_i64 bl, TCGv_i64 bh)
{
    TCGv_i64 th = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 tl = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 zero = tcg_const_i64(tcg_ctx, 0);

    tcg_gen_sub2_i64(tcg_ctx, tl, th, al, zero, bl, zero);
    tcg_gen_andi_i64(tcg_ctx, th, th, 1);
    tcg_gen_sub2_i64(tcg_ctx, tl, th, ah, zero, th, zero);
    tcg_gen_sub2_i64(tcg_ctx, tl, th, tl, th, bh, zero);
    /* "invert" the result: -1 -> 0; 0 -> 1 */
    tcg_gen_addi_i64(tcg_ctx, dl, th, 1);
    tcg_gen_mov_i64(tcg_ctx, dh, zero);

    tcg_temp_free_i64(tcg_ctx, th);
    tcg_temp_free_i64(tcg_ctx, tl);
    tcg_temp_free_i64(tcg_ctx, zero);
}